

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmr.cpp
# Opt level: O3

void __thiscall DSDcc::DSDDMR::DSDDMR(DSDDMR *this,DSDDecoder *dsdDecoder)

{
  this->m_dsdDecoder = dsdDecoder;
  this->m_symbolIndex = 0;
  this->m_cachSymbolIndex = 0;
  this->m_burstType = DSDDMRBurstNone;
  this->m_slot = DSDDMRSlotUndefined;
  this->m_continuation = false;
  this->m_cachOK = false;
  this->m_lcss = '\0';
  this->m_colorCode = '\0';
  this->m_dataType = DSDDMRDataUnknown;
  this->m_voice1EmbSig_dibitsIndex = 0;
  this->m_voice1EmbSig_OK = false;
  (this->m_slot1Addresses).m_group = false;
  (this->m_slot1Addresses).m_target = 0;
  (this->m_slot1Addresses).m_source = 0;
  this->m_voice2EmbSig_dibitsIndex = 0;
  this->m_voice2EmbSig_OK = false;
  (this->m_slot2Addresses).m_group = false;
  (this->m_slot2Addresses).m_target = 0;
  (this->m_slot2Addresses).m_source = 0;
  this->m_voice1FrameCount = 6;
  this->m_voice2FrameCount = 6;
  Hamming_7_4::Hamming_7_4(&this->m_hamming_7_4);
  Golay_20_8::Golay_20_8(&this->m_golay_20_8);
  QR_16_7_6::QR_16_7_6(&this->m_qr_16_7_6);
  Hamming_16_11_4::Hamming_16_11_4(&this->m_hamming_16_11_4);
  this->m_slotText = (this->m_dsdDecoder->m_state).slot0light;
  this->m_voice2EmbSigRawBits[0] = '\0';
  this->m_voice2EmbSigRawBits[1] = '\0';
  this->m_voice2EmbSigRawBits[2] = '\0';
  this->m_voice2EmbSigRawBits[3] = '\0';
  this->m_voice2EmbSigRawBits[4] = '\0';
  this->m_voice2EmbSigRawBits[5] = '\0';
  this->m_voice2EmbSigRawBits[6] = '\0';
  this->m_voice2EmbSigRawBits[7] = '\0';
  this->m_voice2EmbSigRawBits[8] = '\0';
  this->m_voice2EmbSigRawBits[9] = '\0';
  this->m_voice2EmbSigRawBits[10] = '\0';
  this->m_voice2EmbSigRawBits[0xb] = '\0';
  this->m_voice2EmbSigRawBits[0xc] = '\0';
  this->m_voice2EmbSigRawBits[0xd] = '\0';
  this->m_voice2EmbSigRawBits[0xe] = '\0';
  this->m_voice2EmbSigRawBits[0xf] = '\0';
  this->m_voice2EmbSigRawBits[0x10] = '\0';
  this->m_voice2EmbSigRawBits[0x11] = '\0';
  this->m_voice2EmbSigRawBits[0x12] = '\0';
  this->m_voice2EmbSigRawBits[0x13] = '\0';
  this->m_voice2EmbSigRawBits[0x14] = '\0';
  this->m_voice2EmbSigRawBits[0x15] = '\0';
  this->m_voice2EmbSigRawBits[0x16] = '\0';
  this->m_voice2EmbSigRawBits[0x17] = '\0';
  this->m_voice2EmbSigRawBits[0x18] = '\0';
  this->m_voice2EmbSigRawBits[0x19] = '\0';
  this->m_voice2EmbSigRawBits[0x1a] = '\0';
  this->m_voice2EmbSigRawBits[0x1b] = '\0';
  this->m_voice2EmbSigRawBits[0x1c] = '\0';
  this->m_voice2EmbSigRawBits[0x1d] = '\0';
  this->m_voice2EmbSigRawBits[0x1e] = '\0';
  this->m_voice2EmbSigRawBits[0x1f] = '\0';
  this->m_voice2EmbSigRawBits[0x20] = '\0';
  this->m_voice2EmbSigRawBits[0x21] = '\0';
  this->m_voice2EmbSigRawBits[0x22] = '\0';
  this->m_voice2EmbSigRawBits[0x23] = '\0';
  this->m_voice2EmbSigRawBits[0x24] = '\0';
  this->m_voice2EmbSigRawBits[0x25] = '\0';
  this->m_voice2EmbSigRawBits[0x26] = '\0';
  this->m_voice2EmbSigRawBits[0x27] = '\0';
  this->m_voice2EmbSigRawBits[0x28] = '\0';
  this->m_voice2EmbSigRawBits[0x29] = '\0';
  this->m_voice2EmbSigRawBits[0x2a] = '\0';
  this->m_voice2EmbSigRawBits[0x2b] = '\0';
  this->m_voice2EmbSigRawBits[0x2c] = '\0';
  this->m_voice2EmbSigRawBits[0x2d] = '\0';
  this->m_voice2EmbSigRawBits[0x2e] = '\0';
  this->m_voice2EmbSigRawBits[0x2f] = '\0';
  this->m_voice2EmbSigRawBits[0x30] = '\0';
  this->m_voice2EmbSigRawBits[0x31] = '\0';
  this->m_voice2EmbSigRawBits[0x32] = '\0';
  this->m_voice2EmbSigRawBits[0x33] = '\0';
  this->m_voice2EmbSigRawBits[0x34] = '\0';
  this->m_voice2EmbSigRawBits[0x35] = '\0';
  this->m_voice2EmbSigRawBits[0x36] = '\0';
  this->m_voice2EmbSigRawBits[0x37] = '\0';
  this->m_voice2EmbSigRawBits[0x38] = '\0';
  this->m_voice2EmbSigRawBits[0x39] = '\0';
  this->m_voice2EmbSigRawBits[0x3a] = '\0';
  this->m_voice2EmbSigRawBits[0x3b] = '\0';
  this->m_voice2EmbSigRawBits[0x3c] = '\0';
  this->m_voice2EmbSigRawBits[0x3d] = '\0';
  this->m_voice2EmbSigRawBits[0x3e] = '\0';
  this->m_voice2EmbSigRawBits[0x3f] = '\0';
  this->m_voice2EmbSigRawBits[0x40] = '\0';
  this->m_voice2EmbSigRawBits[0x41] = '\0';
  this->m_voice2EmbSigRawBits[0x42] = '\0';
  this->m_voice2EmbSigRawBits[0x43] = '\0';
  this->m_voice2EmbSigRawBits[0x44] = '\0';
  this->m_voice2EmbSigRawBits[0x45] = '\0';
  this->m_voice2EmbSigRawBits[0x46] = '\0';
  this->m_voice2EmbSigRawBits[0x47] = '\0';
  this->m_voice2EmbSigRawBits[0x48] = '\0';
  this->m_voice2EmbSigRawBits[0x49] = '\0';
  this->m_voice2EmbSigRawBits[0x4a] = '\0';
  this->m_voice2EmbSigRawBits[0x4b] = '\0';
  this->m_voice2EmbSigRawBits[0x4c] = '\0';
  this->m_voice2EmbSigRawBits[0x4d] = '\0';
  this->m_voice2EmbSigRawBits[0x4e] = '\0';
  this->m_voice2EmbSigRawBits[0x4f] = '\0';
  this->m_voice2EmbSigRawBits[0x50] = '\0';
  this->m_voice2EmbSigRawBits[0x51] = '\0';
  this->m_voice2EmbSigRawBits[0x52] = '\0';
  this->m_voice2EmbSigRawBits[0x53] = '\0';
  this->m_voice2EmbSigRawBits[0x54] = '\0';
  this->m_voice2EmbSigRawBits[0x55] = '\0';
  this->m_voice2EmbSigRawBits[0x56] = '\0';
  this->m_voice2EmbSigRawBits[0x57] = '\0';
  this->m_voice2EmbSigRawBits[0x58] = '\0';
  this->m_voice2EmbSigRawBits[0x59] = '\0';
  this->m_voice2EmbSigRawBits[0x5a] = '\0';
  this->m_voice2EmbSigRawBits[0x5b] = '\0';
  this->m_voice2EmbSigRawBits[0x5c] = '\0';
  this->m_voice2EmbSigRawBits[0x5d] = '\0';
  this->m_voice2EmbSigRawBits[0x5e] = '\0';
  this->m_voice2EmbSigRawBits[0x5f] = '\0';
  this->m_voice2EmbSigRawBits[0x60] = '\0';
  this->m_voice2EmbSigRawBits[0x61] = '\0';
  this->m_voice2EmbSigRawBits[0x62] = '\0';
  this->m_voice2EmbSigRawBits[99] = '\0';
  this->m_voice2EmbSigRawBits[100] = '\0';
  this->m_voice2EmbSigRawBits[0x65] = '\0';
  this->m_voice2EmbSigRawBits[0x66] = '\0';
  this->m_voice2EmbSigRawBits[0x67] = '\0';
  this->m_voice2EmbSigRawBits[0x68] = '\0';
  this->m_voice2EmbSigRawBits[0x69] = '\0';
  this->m_voice2EmbSigRawBits[0x6a] = '\0';
  this->m_voice2EmbSigRawBits[0x6b] = '\0';
  this->m_voice2EmbSigRawBits[0x6c] = '\0';
  this->m_voice2EmbSigRawBits[0x6d] = '\0';
  this->m_voice2EmbSigRawBits[0x6e] = '\0';
  this->m_voice2EmbSigRawBits[0x6f] = '\0';
  this->m_voice2EmbSigRawBits[0x70] = '\0';
  this->m_voice2EmbSigRawBits[0x71] = '\0';
  this->m_voice2EmbSigRawBits[0x72] = '\0';
  this->m_voice2EmbSigRawBits[0x73] = '\0';
  this->m_voice2EmbSigRawBits[0x74] = '\0';
  this->m_voice2EmbSigRawBits[0x75] = '\0';
  this->m_voice2EmbSigRawBits[0x76] = '\0';
  this->m_voice2EmbSigRawBits[0x77] = '\0';
  this->m_voice2EmbSigRawBits[0x78] = '\0';
  this->m_voice2EmbSigRawBits[0x79] = '\0';
  this->m_voice2EmbSigRawBits[0x7a] = '\0';
  this->m_voice2EmbSigRawBits[0x7b] = '\0';
  this->m_voice2EmbSigRawBits[0x7c] = '\0';
  this->m_voice2EmbSigRawBits[0x7d] = '\0';
  this->m_voice2EmbSigRawBits[0x7e] = '\0';
  this->m_voice2EmbSigRawBits[0x7f] = '\0';
  this->m_syncDibits[0] = '\0';
  this->m_syncDibits[1] = '\0';
  this->m_syncDibits[2] = '\0';
  this->m_syncDibits[3] = '\0';
  this->m_syncDibits[4] = '\0';
  this->m_syncDibits[5] = '\0';
  this->m_syncDibits[6] = '\0';
  this->m_syncDibits[7] = '\0';
  this->m_syncDibits[8] = '\0';
  this->m_syncDibits[9] = '\0';
  this->m_syncDibits[10] = '\0';
  this->m_syncDibits[0xb] = '\0';
  this->m_syncDibits[0xc] = '\0';
  this->m_syncDibits[0xd] = '\0';
  this->m_syncDibits[0xe] = '\0';
  this->m_syncDibits[0xf] = '\0';
  this->m_syncDibits[0x10] = '\0';
  this->m_syncDibits[0x11] = '\0';
  this->m_syncDibits[0x12] = '\0';
  this->m_syncDibits[0x13] = '\0';
  this->m_syncDibits[0x14] = '\0';
  this->m_syncDibits[0x15] = '\0';
  this->m_syncDibits[0x16] = '\0';
  this->m_syncDibits[0x17] = '\0';
  this->m_mbeDVFrame[0] = '\0';
  this->m_mbeDVFrame[1] = '\0';
  this->m_mbeDVFrame[2] = '\0';
  this->m_mbeDVFrame[3] = '\0';
  this->m_mbeDVFrame[4] = '\0';
  this->m_mbeDVFrame[5] = '\0';
  this->m_mbeDVFrame[6] = '\0';
  this->m_mbeDVFrame[7] = '\0';
  this->m_mbeDVFrame[8] = '\0';
  memset(this->m_slotTypePDU_dibits,0,0xba);
  this->w = (int *)0x0;
  this->x = (int *)0x0;
  this->y = (int *)0x0;
  this->z = (int *)0x0;
  return;
}

Assistant:

DSDDMR::DSDDMR(DSDDecoder *dsdDecoder) :
        m_dsdDecoder(dsdDecoder),
        m_symbolIndex(0),
        m_cachSymbolIndex(0),
        m_burstType(DSDDMRBurstNone),
        m_slot(DSDDMRSlotUndefined),
        m_continuation(false),
        m_cachOK(false),
        m_lcss(SingleLC_FirstCSBK),
        m_colorCode(0),
        m_dataType(DSDDMRDataUnknown),
        m_voice1EmbSig_dibitsIndex(0),
        m_voice1EmbSig_OK(false),
        m_voice2EmbSig_dibitsIndex(0),
        m_voice2EmbSig_OK(false),
        m_voice1FrameCount(DMR_VOX_SUPERFRAME_LEN),
        m_voice2FrameCount(DMR_VOX_SUPERFRAME_LEN)
{
    m_slotText = m_dsdDecoder->m_state.slot0light;
    w = 0;
    x = 0;
    y = 0;
    z = 0;

    memset(m_slotTypePDU_dibits, 0, 10);
    memset(m_cachBits, 0, 24);
    memset(m_emb_dibits, 0, 8);
    memset(m_voiceEmbSig_dibits, 0, 16);
    memset(m_voice1EmbSigRawBits, 0, 16*8);
    memset(m_voice2EmbSigRawBits, 0, 16*8);
    memset(m_syncDibits, 0, 24);
    memset(m_mbeDVFrame, 0, 9);
}